

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diskdata.c
# Opt level: O0

void dd_Init(void)

{
  int iVar1;
  FILE *pFVar2;
  FILE *fp;
  char local_408 [4];
  int number;
  char buffer [1024];
  
  pFVar2 = OpenDataFile("r");
  if (pFVar2 != (FILE *)0x0) {
    while (iVar1 = __isoc99_fscanf(pFVar2,"%s%d",local_408,(long)&fp + 4), iVar1 != -1) {
      iVar1 = strcmp(local_408,HighScoreLabel);
      if (iVar1 == 0) {
        StoredData.m_highScore = fp._4_4_;
      }
      else {
        iVar1 = strcmp(local_408,ColorScheme1IdxLabel);
        if (iVar1 == 0) {
          StoredData.m_colorScheme1 = fp._4_4_;
        }
        else {
          iVar1 = strcmp(local_408,ColorScheme2IdxLabel);
          if (iVar1 == 0) {
            StoredData.m_colorScheme2 = fp._4_4_;
          }
        }
      }
    }
    ActiveData.m_colorScheme1 = StoredData.m_colorScheme1;
    ActiveData.m_highScore = StoredData.m_highScore;
    ActiveData.m_colorScheme2 = StoredData.m_colorScheme2;
  }
  return;
}

Assistant:

void dd_Init(void)
{
  char buffer[1024];
  int number;
  FILE* fp = OpenDataFile("r");

  if (fp) {
    while (fscanf(fp, "%s%d", buffer, &number) != EOF) {
      if (strcmp(buffer, HighScoreLabel) == RET_OK) {
        StoredData.m_highScore = number;
      } else if (strcmp(buffer, ColorScheme1IdxLabel) == RET_OK) {
        StoredData.m_colorScheme1 = number;
      } else if (strcmp(buffer, ColorScheme2IdxLabel) == RET_OK) {
        StoredData.m_colorScheme2 = number;
      }
    }
    ActiveData = StoredData;
  }
}